

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_DXT.c
# Opt level: O2

uchar * convert_image_to_DXT1(uchar *uncompressed,int width,int height,int channels,int *out_size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uchar *puVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uchar *puVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  int local_f4;
  int local_f0;
  int local_ec;
  uchar cblock [8];
  uchar ublock [48];
  
  *out_size = 0;
  iVar5 = 0;
  if (channels - 5U < 0xfffffffc || (uncompressed == (uchar *)0x0 || (height < 1 || width < 1))) {
    puVar7 = (uchar *)0x0;
  }
  else {
    uVar6 = (uint)(2U < (uint)channels);
    uVar14 = (width * 2 + 6U & 0xfffffff8) * (height + 3U >> 2);
    *out_size = uVar14;
    puVar7 = (uchar *)malloc((ulong)uVar14);
    iVar2 = channels * width;
    iVar3 = iVar2 * 4;
    iVar1 = channels * 4;
    local_f4 = (uint)(2U < (uint)channels) * 2;
    iVar17 = 0;
    uVar8 = 0;
    while (uVar8 < (uint)height) {
      iVar18 = height - (int)uVar8;
      if ((int)(uVar8 + 4) < height) {
        iVar18 = 4;
      }
      local_ec = local_f4;
      uVar9 = 0;
      local_f0 = iVar5;
      uVar14 = uVar6;
      while (uVar9 < (uint)width) {
        iVar12 = width - (int)uVar9;
        if ((int)(uVar9 + 4) < width) {
          iVar12 = 4;
        }
        iVar4 = 0;
        iVar16 = local_ec;
        iVar19 = local_f0;
        uVar13 = uVar14;
        for (lVar15 = 0; iVar22 = iVar18, lVar15 < iVar18; lVar15 = lVar15 + 1) {
          lVar21 = (long)iVar4;
          puVar20 = ublock + lVar21 + 2;
          iVar22 = iVar19;
          iVar23 = iVar16;
          uVar24 = uVar13;
          for (lVar11 = 0; iVar10 = iVar12, lVar11 < iVar12; lVar11 = lVar11 + 1) {
            ublock[lVar21] = uncompressed[iVar22];
            ublock[lVar21 + 1] = uncompressed[(int)uVar24];
            ublock[lVar21 + 2] = uncompressed[iVar23];
            lVar21 = lVar21 + 3;
            iVar22 = iVar22 + channels;
            iVar23 = iVar23 + channels;
            uVar24 = uVar24 + channels;
            iVar4 = iVar4 + 3;
            puVar20 = puVar20 + 3;
          }
          for (; iVar10 < 4; iVar10 = iVar10 + 1) {
            puVar20[-2] = ublock[0];
            puVar20[-1] = ublock[1];
            *puVar20 = ublock[2];
            iVar4 = iVar4 + 3;
            puVar20 = puVar20 + 3;
          }
          iVar19 = iVar19 + iVar2;
          iVar16 = iVar16 + iVar2;
          uVar13 = uVar13 + iVar2;
        }
        for (; iVar22 < 4; iVar22 = iVar22 + 1) {
          lVar15 = (long)iVar4;
          for (lVar11 = 0; (int)lVar11 != 0xc; lVar11 = lVar11 + 3) {
            ublock[lVar11 + lVar15] = ublock[0];
            ublock[lVar11 + lVar15 + 1] = ublock[1];
            ublock[lVar11 + lVar15 + 2] = ublock[2];
          }
          iVar4 = iVar4 + 0xc;
        }
        compress_DDS_color_block(3,ublock,cblock);
        for (lVar15 = 0; lVar15 != 8; lVar15 = lVar15 + 1) {
          puVar7[lVar15 + iVar17] = cblock[lVar15];
        }
        iVar17 = iVar17 + 8;
        local_f0 = local_f0 + iVar1;
        local_ec = local_ec + iVar1;
        uVar14 = uVar14 + iVar1;
        uVar9 = uVar9 + 4;
      }
      iVar5 = iVar5 + iVar3;
      local_f4 = local_f4 + iVar3;
      uVar6 = uVar6 + iVar3;
      uVar8 = uVar8 + 4;
    }
  }
  return puVar7;
}

Assistant:

unsigned char* convert_image_to_DXT1(
		const unsigned char *const uncompressed,
		int width, int height, int channels,
		int *out_size )
{
	unsigned char *compressed;
	int i, j, x, y;
	unsigned char ublock[16*3];
	unsigned char cblock[8];
	int index = 0, chan_step = 1;
	int block_count = 0;
	/*	error check	*/
	*out_size = 0;
	if( (width < 1) || (height < 1) ||
		(NULL == uncompressed) ||
		(channels < 1) || (channels > 4) )
	{
		return NULL;
	}
	/*	for channels == 1 or 2, I do not step forward for R,G,B values	*/
	if( channels < 3 )
	{
		chan_step = 0;
	}
	/*	get the RAM for the compressed image
		(8 bytes per 4x4 pixel block)	*/
	*out_size = ((width+3) >> 2) * ((height+3) >> 2) * 8;
	compressed = (unsigned char*)malloc( *out_size );
	/*	go through each block	*/
	for( j = 0; j < height; j += 4 )
	{
		for( i = 0; i < width; i += 4 )
		{
			/*	copy this block into a new one	*/
			int idx = 0;
			int mx = 4, my = 4;
			if( j+4 >= height )
			{
				my = height - j;
			}
			if( i+4 >= width )
			{
				mx = width - i;
			}
			for( y = 0; y < my; ++y )
			{
				for( x = 0; x < mx; ++x )
				{
					ublock[idx++] = uncompressed[(j+y)*width*channels+(i+x)*channels];
					ublock[idx++] = uncompressed[(j+y)*width*channels+(i+x)*channels+chan_step];
					ublock[idx++] = uncompressed[(j+y)*width*channels+(i+x)*channels+chan_step+chan_step];
				}
				for( x = mx; x < 4; ++x )
				{
					ublock[idx++] = ublock[0];
					ublock[idx++] = ublock[1];
					ublock[idx++] = ublock[2];
				}
			}
			for( y = my; y < 4; ++y )
			{
				for( x = 0; x < 4; ++x )
				{
					ublock[idx++] = ublock[0];
					ublock[idx++] = ublock[1];
					ublock[idx++] = ublock[2];
				}
			}
			/*	compress the block	*/
			++block_count;
			compress_DDS_color_block( 3, ublock, cblock );
			/*	copy the data from the block into the main block	*/
			for( x = 0; x < 8; ++x )
			{
				compressed[index++] = cblock[x];
			}
		}
	}
	return compressed;
}